

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O1

int32_t uloc_setKeywordValue_63
                  (char *keywordName,char *keywordValue,char *buffer,int32_t bufferCapacity,
                  UErrorCode *status)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  UBool UVar4;
  char cVar5;
  int32_t sLength;
  uint uVar6;
  uint uVar7;
  int iVar8;
  size_t sVar9;
  char *__dest;
  char *__s;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  UErrorCode UVar13;
  int iVar14;
  int sLength_00;
  int32_t iVar15;
  ulong uVar16;
  ulong uVar17;
  char *pcVar18;
  int sLength_01;
  CharString updatedKeysAndValues;
  char keywordNameBuffer [25];
  char localeKeywordNameBuffer [25];
  char keywordValueBuffer [97];
  char local_155;
  int local_138;
  CharString local_118;
  char local_d8 [32];
  char local_b8 [32];
  char local_98 [104];
  
  icu_63::MaybeStackArray<char,_40>::MaybeStackArray(&local_118.buffer);
  local_118.len = 0;
  *local_118.buffer.ptr = '\0';
  iVar15 = -1;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (((keywordName != (char *)0x0) && (1 < bufferCapacity)) && (*keywordName != '\0')) {
      sVar9 = strlen(buffer);
      iVar14 = (int)sVar9;
      if (iVar14 <= bufferCapacity) {
        sLength = locale_canonKeywordName(local_d8,keywordName,status);
        iVar15 = 0;
        if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
          uVar17 = 0;
          if ((keywordValue != (char *)0x0) && (cVar5 = *keywordValue, cVar5 != '\0')) {
            uVar16 = 0;
            do {
              UVar4 = uprv_isASCIILetter_63(cVar5);
              if (((UVar4 == '\0') && (9 < (byte)(keywordValue[uVar16] - 0x30U))) &&
                 ((uVar6 = (byte)keywordValue[uVar16] - 0x2b, 0x34 < uVar6 ||
                  ((0x10000000000015U >> ((ulong)uVar6 & 0x3f) & 1) == 0)))) goto LAB_002b9550;
              if (uVar16 == 0x60) {
                *status = U_INTERNAL_PROGRAM_ERROR;
                goto LAB_002b9557;
              }
              uVar17 = uVar16 + 1;
              local_98[uVar16] = keywordValue[uVar16];
              cVar5 = keywordValue[uVar16 + 1];
              uVar16 = uVar17;
            } while (cVar5 != '\0');
          }
          sLength_01 = (int)uVar17;
          local_98[uVar17 & 0xffffffff] = '\0';
          __dest = strchr(buffer,0x40);
          if ((__dest == (char *)0x0) || (__dest[1] == '\0')) {
            iVar15 = iVar14;
            if (sLength_01 != 0) {
              iVar15 = iVar14 + sLength + sLength_01 + (uint)(__dest == (char *)0x0) + 1;
              if (iVar15 < bufferCapacity) {
                pcVar18 = buffer + iVar14;
                if (__dest != (char *)0x0) {
                  pcVar18 = __dest;
                }
                *pcVar18 = '@';
                strcpy(pcVar18 + 1,local_d8);
                pcVar18[(long)sLength + 1] = '=';
                strcpy(pcVar18 + (long)sLength + 2,local_98);
              }
              else {
LAB_002b9a6a:
                *status = U_BUFFER_OVERFLOW_ERROR;
              }
            }
          }
          else {
            local_155 = '@';
            bVar2 = false;
            pcVar18 = __dest;
            do {
              if (pcVar18 == (char *)0x0) {
                iVar15 = iVar14;
                if ((bVar2) && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
                  local_138 = (int)buffer;
                  iVar15 = ((int)__dest - local_138) + local_118.len;
                  if (bufferCapacity <= iVar15) goto LAB_002b9a6a;
                  if (0 < local_118.len) {
                    strncpy(__dest,local_118.buffer.ptr,(ulong)(uint)local_118.len);
                  }
                  buffer[iVar15] = '\0';
                }
                break;
              }
              __s = strchr(pcVar18 + 1,0x3d);
              UVar13 = U_ILLEGAL_ARGUMENT_ERROR;
              pcVar11 = pcVar18 + 1;
              if (__s == (char *)0x0) {
LAB_002b9983:
                pcVar10 = pcVar11;
                *status = UVar13;
                bVar1 = false;
              }
              else {
                do {
                  pcVar11 = pcVar18 + 1;
                  pcVar18 = pcVar18 + 1;
                  pcVar10 = __s;
                } while (*pcVar11 == ' ');
                do {
                  pcVar12 = pcVar10;
                  if (pcVar12 <= pcVar18) break;
                  pcVar10 = pcVar12 + -1;
                } while (pcVar12[-1] == ' ');
                pcVar11 = pcVar18;
                if (pcVar12 == pcVar18) goto LAB_002b9983;
                uVar16 = 0;
                uVar17 = uVar16;
                if (pcVar18 < pcVar12) {
                  do {
                    UVar4 = uprv_isASCIILetter_63(pcVar18[uVar16]);
                    if ((UVar4 == '\0') && (9 < (byte)(pcVar18[uVar16] - 0x30U))) {
                      UVar13 = U_ILLEGAL_ARGUMENT_ERROR;
LAB_002b9980:
                      pcVar11 = pcVar18 + uVar16;
                      goto LAB_002b9983;
                    }
                    if (uVar16 == 0x18) {
                      UVar13 = U_INTERNAL_PROGRAM_ERROR;
                      goto LAB_002b9980;
                    }
                    cVar5 = uprv_asciitolower_63(pcVar18[uVar16]);
                    uVar17 = uVar16 + 1;
                    local_b8[uVar16] = cVar5;
                    lVar3 = uVar16 + 1;
                    uVar16 = uVar17;
                  } while (pcVar18 + lVar3 < pcVar12);
                  pcVar18 = pcVar18 + uVar17;
                }
                local_b8[uVar17 & 0xffffffff] = '\0';
                pcVar10 = strchr(__s,0x3b);
                uVar6 = ~(uint)__s;
                do {
                  uVar7 = uVar6;
                  pcVar11 = __s + 1;
                  __s = __s + 1;
                  uVar6 = uVar7 - 1;
                } while (*pcVar11 == ' ');
                pcVar11 = pcVar10;
                if (pcVar10 == (char *)0x0) {
                  sVar9 = strlen(__s);
                  pcVar11 = __s + sVar9;
                }
                iVar8 = uVar7 + (int)pcVar11;
                do {
                  sLength_00 = iVar8;
                  pcVar12 = pcVar11;
                  if (pcVar12 <= __s) break;
                  pcVar11 = pcVar12 + -1;
                  iVar8 = sLength_00 + -1;
                } while (pcVar12[-1] == ' ');
                UVar13 = U_ILLEGAL_ARGUMENT_ERROR;
                pcVar11 = pcVar18;
                if (pcVar12 == __s) goto LAB_002b9983;
                iVar8 = strcmp(local_d8,local_b8);
                if (iVar8 == 0) {
                  bVar2 = true;
                  if (sLength_01 != 0) {
                    icu_63::CharString::append(&local_118,local_155,status);
                    icu_63::CharString::append(&local_118,local_d8,sLength,status);
                    icu_63::CharString::append(&local_118,'=',status);
                    local_155 = ';';
                    icu_63::CharString::append(&local_118,local_98,sLength_01,status);
                  }
                }
                else {
                  if ((!bVar2 && sLength_01 != 0) && iVar8 < 0) {
                    icu_63::CharString::append(&local_118,local_155,status);
                    icu_63::CharString::append(&local_118,local_d8,sLength,status);
                    icu_63::CharString::append(&local_118,'=',status);
                    icu_63::CharString::append(&local_118,local_98,sLength_01,status);
                    local_155 = ';';
                    bVar2 = true;
                  }
                  icu_63::CharString::append(&local_118,local_155,status);
                  icu_63::CharString::append(&local_118,local_b8,(int32_t)uVar17,status);
                  icu_63::CharString::append(&local_118,'=',status);
                  local_155 = ';';
                  icu_63::CharString::append(&local_118,__s,sLength_00,status);
                }
                bVar1 = true;
                if ((pcVar10 == (char *)0x0 && sLength_01 != 0) && !bVar2) {
                  icu_63::CharString::append(&local_118,local_155,status);
                  icu_63::CharString::append(&local_118,local_d8,sLength,status);
                  icu_63::CharString::append(&local_118,'=',status);
                  bVar2 = true;
                  icu_63::CharString::append(&local_118,local_98,sLength_01,status);
                  bVar1 = true;
                }
              }
              iVar15 = 0;
              pcVar18 = pcVar10;
            } while (bVar1);
          }
        }
        goto LAB_002b9559;
      }
    }
LAB_002b9550:
    *status = U_ILLEGAL_ARGUMENT_ERROR;
LAB_002b9557:
    iVar15 = 0;
  }
LAB_002b9559:
  icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&local_118.buffer);
  return iVar15;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uloc_setKeywordValue(const char* keywordName,
                     const char* keywordValue,
                     char* buffer, int32_t bufferCapacity,
                     UErrorCode* status)
{
    /* TODO: sorting. removal. */
    int32_t keywordNameLen;
    int32_t keywordValueLen;
    int32_t bufLen;
    int32_t needLen = 0;
    char keywordNameBuffer[ULOC_KEYWORD_BUFFER_LEN];
    char keywordValueBuffer[ULOC_KEYWORDS_CAPACITY+1];
    char localeKeywordNameBuffer[ULOC_KEYWORD_BUFFER_LEN];
    int32_t rc;
    char* nextSeparator = NULL;
    char* nextEqualsign = NULL;
    char* startSearchHere = NULL;
    char* keywordStart = NULL;
    CharString updatedKeysAndValues;
    int32_t updatedKeysAndValuesLen;
    UBool handledInputKeyAndValue = FALSE;
    char keyValuePrefix = '@';

    if(U_FAILURE(*status)) {
        return -1;
    }
    if (keywordName == NULL || keywordName[0] == 0 || bufferCapacity <= 1) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    bufLen = (int32_t)uprv_strlen(buffer);
    if(bufferCapacity<bufLen) {
        /* The capacity is less than the length?! Is this NULL terminated? */
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    keywordNameLen = locale_canonKeywordName(keywordNameBuffer, keywordName, status);
    if(U_FAILURE(*status)) {
        return 0;
    }

    keywordValueLen = 0;
    if(keywordValue) {
        while (*keywordValue != 0) {
            if (!UPRV_ISALPHANUM(*keywordValue) && !UPRV_OK_VALUE_PUNCTUATION(*keywordValue)) {
                *status = U_ILLEGAL_ARGUMENT_ERROR; /* malformed key value */
                return 0;
            }
            if (keywordValueLen < ULOC_KEYWORDS_CAPACITY) {
                /* Should we force lowercase in value to set? */
                keywordValueBuffer[keywordValueLen++] = *keywordValue++;
            } else {
                /* keywordValue too long for internal buffer */
                *status = U_INTERNAL_PROGRAM_ERROR;
                return 0;
            }
        }
    }
    keywordValueBuffer[keywordValueLen] = 0; /* terminate */

    startSearchHere = (char*)locale_getKeywordsStart(buffer);
    if(startSearchHere == NULL || (startSearchHere[1]==0)) {
        if(keywordValueLen == 0) { /* no keywords = nothing to remove */
            return bufLen;
        }

        needLen = bufLen+1+keywordNameLen+1+keywordValueLen;
        if(startSearchHere) { /* had a single @ */
            needLen--; /* already had the @ */
            /* startSearchHere points at the @ */
        } else {
            startSearchHere=buffer+bufLen;
        }
        if(needLen >= bufferCapacity) {
            *status = U_BUFFER_OVERFLOW_ERROR;
            return needLen; /* no change */
        }
        *startSearchHere++ = '@';
        uprv_strcpy(startSearchHere, keywordNameBuffer);
        startSearchHere += keywordNameLen;
        *startSearchHere++ = '=';
        uprv_strcpy(startSearchHere, keywordValueBuffer);
        return needLen;
    } /* end shortcut - no @ */

    keywordStart = startSearchHere;
    /* search for keyword */
    while(keywordStart) {
        const char* keyValueTail;
        int32_t keyValueLen;

        keywordStart++; /* skip @ or ; */
        nextEqualsign = uprv_strchr(keywordStart, '=');
        if (!nextEqualsign) {
            *status = U_ILLEGAL_ARGUMENT_ERROR; /* key must have =value */
            return 0;
        }
        /* strip leading & trailing spaces (TC decided to tolerate these) */
        while(*keywordStart == ' ') {
            keywordStart++;
        }
        keyValueTail = nextEqualsign;
        while (keyValueTail > keywordStart && *(keyValueTail-1) == ' ') {
            keyValueTail--;
        }
        /* now keyValueTail points to first char after the keyName */
        /* copy & normalize keyName from locale */
        if (keywordStart == keyValueTail) {
            *status = U_ILLEGAL_ARGUMENT_ERROR; /* empty keyword name in passed-in locale */
            return 0;
        }
        keyValueLen = 0;
        while (keywordStart < keyValueTail) {
            if (!UPRV_ISALPHANUM(*keywordStart)) {
                *status = U_ILLEGAL_ARGUMENT_ERROR; /* malformed keyword name */
                return 0;
            }
            if (keyValueLen < ULOC_KEYWORD_BUFFER_LEN - 1) {
                localeKeywordNameBuffer[keyValueLen++] = uprv_tolower(*keywordStart++);
            } else {
                /* keyword name too long for internal buffer */
                *status = U_INTERNAL_PROGRAM_ERROR;
                return 0;
            }
        }
        localeKeywordNameBuffer[keyValueLen] = 0; /* terminate */

        nextSeparator = uprv_strchr(nextEqualsign, ';');

        /* start processing the value part */
        nextEqualsign++; /* skip '=' */
        /* First strip leading & trailing spaces (TC decided to tolerate these) */
        while(*nextEqualsign == ' ') {
            nextEqualsign++;
        }
        keyValueTail = (nextSeparator)? nextSeparator: nextEqualsign + uprv_strlen(nextEqualsign);
        while(keyValueTail > nextEqualsign && *(keyValueTail-1) == ' ') {
            keyValueTail--;
        }
        if (nextEqualsign == keyValueTail) {
            *status = U_ILLEGAL_ARGUMENT_ERROR; /* empty key value in passed-in locale */
            return 0;
        }

        rc = uprv_strcmp(keywordNameBuffer, localeKeywordNameBuffer);
        if(rc == 0) {
            /* Current entry matches the input keyword. Update the entry */
            if(keywordValueLen > 0) { /* updating a value */
                updatedKeysAndValues.append(keyValuePrefix, *status);
                keyValuePrefix = ';'; /* for any subsequent key-value pair */
                updatedKeysAndValues.append(keywordNameBuffer, keywordNameLen, *status);
                updatedKeysAndValues.append('=', *status);
                updatedKeysAndValues.append(keywordValueBuffer, keywordValueLen, *status);
            } /* else removing this entry, don't emit anything */
            handledInputKeyAndValue = TRUE;
        } else {
           /* input keyword sorts earlier than current entry, add before current entry */
            if (rc < 0 && keywordValueLen > 0 && !handledInputKeyAndValue) {
                /* insert new entry at this location */
                updatedKeysAndValues.append(keyValuePrefix, *status);
                keyValuePrefix = ';'; /* for any subsequent key-value pair */
                updatedKeysAndValues.append(keywordNameBuffer, keywordNameLen, *status);
                updatedKeysAndValues.append('=', *status);
                updatedKeysAndValues.append(keywordValueBuffer, keywordValueLen, *status);
                handledInputKeyAndValue = TRUE;
            }
            /* copy the current entry */
            updatedKeysAndValues.append(keyValuePrefix, *status);
            keyValuePrefix = ';'; /* for any subsequent key-value pair */
            updatedKeysAndValues.append(localeKeywordNameBuffer, keyValueLen, *status);
            updatedKeysAndValues.append('=', *status);
            updatedKeysAndValues.append(nextEqualsign, static_cast<int32_t>(keyValueTail-nextEqualsign), *status);
        }
        if (!nextSeparator && keywordValueLen > 0 && !handledInputKeyAndValue) {
            /* append new entry at the end, it sorts later than existing entries */
            updatedKeysAndValues.append(keyValuePrefix, *status);
            /* skip keyValuePrefix update, no subsequent key-value pair */
            updatedKeysAndValues.append(keywordNameBuffer, keywordNameLen, *status);
            updatedKeysAndValues.append('=', *status);
            updatedKeysAndValues.append(keywordValueBuffer, keywordValueLen, *status);
            handledInputKeyAndValue = TRUE;
        }
        keywordStart = nextSeparator;
    } /* end loop searching */

    /* Any error from updatedKeysAndValues.append above would be internal and not due to
     * problems with the passed-in locale. So if we did encounter problems with the
     * passed-in locale above, those errors took precedence and overrode any error
     * status from updatedKeysAndValues.append, and also caused a return of 0. If there
     * are errors here they are from updatedKeysAndValues.append; they do cause an
     * error return but the passed-in locale is unmodified and the original bufLen is
     * returned.
     */
    if (!handledInputKeyAndValue || U_FAILURE(*status)) {
        /* if input key/value specified removal of a keyword not present in locale, or
         * there was an error in CharString.append, leave original locale alone. */
        return bufLen;
    }

    updatedKeysAndValuesLen = updatedKeysAndValues.length();
    /* needLen = length of the part before '@' + length of updated key-value part including '@' */
    needLen = (int32_t)(startSearchHere - buffer) + updatedKeysAndValuesLen;
    if(needLen >= bufferCapacity) {
        *status = U_BUFFER_OVERFLOW_ERROR;
        return needLen; /* no change */
    }
    if (updatedKeysAndValuesLen > 0) {
        uprv_strncpy(startSearchHere, updatedKeysAndValues.data(), updatedKeysAndValuesLen);
    }
    buffer[needLen]=0;
    return needLen;
}